

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::AddWithCarry
          (BigUnsigned<84> *this,int index,uint32_t value)

{
  uint32_t *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (value != 0) {
    for (; (index < 0x54 && (value != 0)); value = (uint32_t)CARRY4(uVar2,value)) {
      puVar1 = this->words_ + index;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + value;
      index = index + (uint)CARRY4(uVar2,value);
    }
    iVar4 = index + 1;
    if (index + 1 <= this->size_) {
      iVar4 = this->size_;
    }
    iVar3 = 0x54;
    if (iVar4 < 0x54) {
      iVar3 = iVar4;
    }
    this->size_ = iVar3;
  }
  return;
}

Assistant:

void AddWithCarry(int index, uint32_t value) {
    if (value) {
      while (index < max_words && value > 0) {
        words_[index] += value;
        // carry if we overflowed in this word:
        if (value > words_[index]) {
          value = 1;
          ++index;
        } else {
          value = 0;
        }
      }
      size_ = (std::min)(max_words, (std::max)(index + 1, size_));
    }
  }